

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

bool __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::has_star_in_row(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                  *this,Index row)

{
  bool bVar1;
  pointer this_00;
  Value __n;
  reference pvVar2;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  *in_RDI;
  AdjacencyIterator it;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (Adjacency<unsigned_long> *)
       andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
       adjacenciesFromVertexBegin(in_stack_ffffffffffffffc8,0x1d0675);
  while( true ) {
    andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
    adjacenciesFromVertexEnd(in_stack_ffffffffffffffc8,0x1d068c);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return false;
    }
    in_stack_ffffffffffffffc8 =
         (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)in_RDI[2]._M_current;
    this_00 = __gnu_cxx::
              __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
              ::operator->(local_20);
    __n = andres::graph::Adjacency<unsigned_long>::edge(this_00);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc8,__n);
    if (*pvVar2 == 1) break;
    __gnu_cxx::
    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
    ::operator++(local_20);
  }
  return true;
}

Assistant:

bool
Matching<GRAPH, COST, MASK>::has_star_in_row(Index const row) const
{
    for (auto it = graph_.adjacenciesFromVertexBegin(row);
         it != graph_.adjacenciesFromVertexEnd(row); ++it)
        if (mask_[it->edge()] == STARRED)
            return true;
    return false;
}